

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::prepare_insert(raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                 *this,size_t hashval)

{
  FindInfo FVar1;
  
  FVar1 = find_first_non_full(this,hashval);
  if (((this->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl == 0) &&
     (this->ctrl_[FVar1.offset] != -2)) {
    rehash_and_grow_if_necessary(this);
    FVar1 = find_first_non_full(this,hashval);
  }
  this->size_ = this->size_ + 1;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (this->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl -
       (ulong)(this->ctrl_[FVar1.offset] == -0x80);
  return FVar1.offset;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                rehash_and_grow_if_necessary();
        }
        FindInfo target = find_first_non_full(hashval);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hashval);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        // set_ctrl(target.offset, H2(hashval));
        infoz_.RecordInsert(hashval, target.probe_length);
        return target.offset;
    }